

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CriticalSectionsBuilder.cpp
# Opt level: O0

bool __thiscall
CriticalSectionsBuilder::buildCriticalSection(CriticalSectionsBuilder *this,LockNode *lock)

{
  bool bVar1;
  LockNode *lock_00;
  LockNode *in_RSI;
  CriticalSectionsBuilder *in_RDI;
  bool changed;
  CriticalSection *criticalSection;
  iterator iterator;
  Node *in_stack_ffffffffffffff58;
  CriticalSection *in_stack_ffffffffffffff60;
  CriticalSectionsBuilder *this_00;
  map<const_llvm::CallInst_*,_CriticalSection_*,_std::less<const_llvm::CallInst_*>,_std::allocator<std::pair<const_llvm::CallInst_*const,_CriticalSection_*>_>_>
  *__args;
  _Self local_30;
  CallInst *local_28;
  _Self local_20;
  LockNode *local_18;
  bool local_1;
  
  __args = &in_RDI->criticalSections_;
  local_18 = in_RSI;
  local_28 = Node::callInstruction(in_stack_ffffffffffffff58);
  local_20._M_node =
       (_Base_ptr)
       std::
       map<const_llvm::CallInst_*,_CriticalSection_*,_std::less<const_llvm::CallInst_*>,_std::allocator<std::pair<const_llvm::CallInst_*const,_CriticalSection_*>_>_>
       ::find((map<const_llvm::CallInst_*,_CriticalSection_*,_std::less<const_llvm::CallInst_*>,_std::allocator<std::pair<const_llvm::CallInst_*const,_CriticalSection_*>_>_>
               *)in_stack_ffffffffffffff58,(key_type *)0x1aee86);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<const_llvm::CallInst_*,_CriticalSection_*,_std::less<const_llvm::CallInst_*>,_std::allocator<std::pair<const_llvm::CallInst_*const,_CriticalSection_*>_>_>
       ::end((map<const_llvm::CallInst_*,_CriticalSection_*,_std::less<const_llvm::CallInst_*>,_std::allocator<std::pair<const_llvm::CallInst_*const,_CriticalSection_*>_>_>
              *)in_stack_ffffffffffffff58);
  bVar1 = std::operator!=(&local_20,&local_30);
  if (bVar1) {
    local_1 = false;
  }
  else {
    lock_00 = (LockNode *)operator_new(0x38);
    CriticalSection::CriticalSection(in_stack_ffffffffffffff60,lock_00);
    this_00 = (CriticalSectionsBuilder *)&in_RDI->criticalSections_;
    Node::callInstruction(&lock_00->super_Node);
    std::
    map<llvm::CallInst_const*,CriticalSection*,std::less<llvm::CallInst_const*>,std::allocator<std::pair<llvm::CallInst_const*const,CriticalSection*>>>
    ::emplace<llvm::CallInst_const*,CriticalSection*&>
              ((map<const_llvm::CallInst_*,_CriticalSection_*,_std::less<const_llvm::CallInst_*>,_std::allocator<std::pair<const_llvm::CallInst_*const,_CriticalSection_*>_>_>
                *)in_RDI,(CallInst **)__args,(CriticalSection **)this_00);
    in_RDI->currentLock = local_18;
    LockNode::correspondingUnlocks(lock_00);
    std::set<UnlockNode_*,_std::less<UnlockNode_*>,_std::allocator<UnlockNode_*>_>::operator=
              ((set<UnlockNode_*,_std::less<UnlockNode_*>,_std::allocator<UnlockNode_*>_> *)this_00,
               (set<UnlockNode_*,_std::less<UnlockNode_*>,_std::allocator<UnlockNode_*>_> *)lock_00)
    ;
    std::set<UnlockNode_*,_std::less<UnlockNode_*>,_std::allocator<UnlockNode_*>_>::~set
              ((set<UnlockNode_*,_std::less<UnlockNode_*>,_std::allocator<UnlockNode_*>_> *)0x1aef72
              );
    visitNode(this_00,&lock_00->super_Node);
    bVar1 = populateCriticalSection(in_RDI);
    std::set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_>::clear
              ((set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_> *)0x1aefa5);
    local_1 = bVar1;
  }
  return local_1;
}

Assistant:

bool CriticalSectionsBuilder::buildCriticalSection(LockNode *lock) {
    auto iterator = criticalSections_.find(lock->callInstruction());
    if (iterator != criticalSections_.end()) {
        return false;
    }

    auto *criticalSection = new CriticalSection(lock);
    criticalSections_.emplace(lock->callInstruction(), criticalSection);

    currentLock = lock;
    currentUnlocks = lock->correspondingUnlocks();
    visitNode(lock);
    bool changed = populateCriticalSection();
    examined_.clear();
    return changed;
}